

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O0

void __thiscall
Assimp::SpatialSort::FindIdenticalPositions
          (SpatialSort *this,aiVector3D *pPosition,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar2;
  BinFloat BVar3;
  BinFloat BVar4;
  BinFloat BVar5;
  size_type sVar6;
  const_reference pvVar7;
  pointer pEVar8;
  aiVector3t<float> aVar9;
  __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
  local_70;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  float local_4c;
  __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
  local_48;
  __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
  local_40;
  const_iterator it;
  uint local_30;
  uint binaryStepSize;
  uint index;
  BinFloat maxDistBinary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_20;
  BinFloat minDistBinary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults_local;
  aiVector3D *pPosition_local;
  SpatialSort *this_local;
  
  pvStack_20 = poResults;
  poResults_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pPosition;
  pPosition_local = &this->mPlaneNormal;
  index = (uint)::operator*(pPosition,&this->mPlaneNormal);
  BVar3 = anon_unknown.dwarf_30d8f1::ToBinary((ai_real *)&index);
  maxDistBinary = BVar3 + -5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(pvStack_20,0);
  sVar6 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::size
                    (&this->mPositions);
  local_30 = (uint)(sVar6 >> 1) & 0x7fffffff;
  sVar6 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::size
                    (&this->mPositions);
  for (it._M_current._4_4_ = (uint)(sVar6 >> 2) & 0x3fffffff; BVar5 = maxDistBinary,
      1 < it._M_current._4_4_; it._M_current._4_4_ = it._M_current._4_4_ >> 1) {
    pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
             operator[](&this->mPositions,(ulong)local_30);
    BVar4 = anon_unknown.dwarf_30d8f1::ToBinary(&pvVar7->mDistance);
    uVar1 = it._M_current._4_4_;
    if (BVar5 <= BVar4) {
      uVar1 = -it._M_current._4_4_;
    }
    local_30 = uVar1 + local_30;
  }
  while( true ) {
    BVar5 = maxDistBinary;
    bVar2 = false;
    if (local_30 != 0) {
      pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ::operator[](&this->mPositions,(ulong)local_30);
      BVar4 = anon_unknown.dwarf_30d8f1::ToBinary(&pvVar7->mDistance);
      bVar2 = BVar5 < BVar4;
    }
    if (!bVar2) break;
    local_30 = local_30 - 1;
  }
  while( true ) {
    sVar6 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
            size(&this->mPositions);
    BVar5 = maxDistBinary;
    bVar2 = false;
    if ((ulong)local_30 < sVar6 - 1) {
      pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ::operator[](&this->mPositions,(ulong)local_30);
      BVar4 = anon_unknown.dwarf_30d8f1::ToBinary(&pvVar7->mDistance);
      bVar2 = BVar4 < BVar5;
    }
    if (!bVar2) break;
    local_30 = local_30 + 1;
  }
  local_48._M_current =
       (Entry *)std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                ::begin(&this->mPositions);
  local_40 = __gnu_cxx::
             __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
             ::operator+(&local_48,(ulong)local_30);
  do {
    pEVar8 = __gnu_cxx::
             __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
             ::operator->(&local_40);
    BVar5 = anon_unknown.dwarf_30d8f1::ToBinary(&pEVar8->mDistance);
    if (BVar3 + 5 <= BVar5) {
      return;
    }
    pEVar8 = __gnu_cxx::
             __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
             ::operator->(&local_40);
    aVar9 = ::operator-(&pEVar8->mPosition,(aiVector3t<float> *)poResults_local);
    local_68._0_8_ = aVar9._0_8_;
    local_58.x = local_68.x;
    local_58.y = local_68.y;
    local_68.z = aVar9.z;
    local_58.z = local_68.z;
    local_68 = aVar9;
    local_4c = aiVector3t<float>::SquareLength(&local_58);
    BVar5 = anon_unknown.dwarf_30d8f1::ToBinary(&local_4c);
    this_00 = pvStack_20;
    if (BVar5 < 7) {
      pEVar8 = __gnu_cxx::
               __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
               ::operator->(&local_40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&pEVar8->mIndex);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
    ::operator++(&local_40);
    local_70._M_current =
         (Entry *)std::
                  vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
                  end(&this->mPositions);
    bVar2 = __gnu_cxx::operator==(&local_40,&local_70);
  } while (!bVar2);
  return;
}

Assistant:

void SpatialSort::FindIdenticalPositions( const aiVector3D& pPosition,
    std::vector<unsigned int>& poResults) const
{
    // Epsilons have a huge disadvantage: they are of constant precision, while floating-point
    //  values are of log2 precision. If you apply e=0.01 to 100, the epsilon is rather small, but
    //  if you apply it to 0.001, it is enormous.

    // The best way to overcome this is the unit in the last place (ULP). A precision of 2 ULPs
    //  tells us that a float does not differ more than 2 bits from the "real" value. ULPs are of
    //  logarithmic precision - around 1, they are 1*(2^24) and around 10000, they are 0.00125.

    // For standard C math, we can assume a precision of 0.5 ULPs according to IEEE 754. The
    //  incoming vertex positions might have already been transformed, probably using rather
    //  inaccurate SSE instructions, so we assume a tolerance of 4 ULPs to safely identify
    //  identical vertex positions.
    static const int toleranceInULPs = 4;
    // An interesting point is that the inaccuracy grows linear with the number of operations:
    //  multiplying to numbers, each inaccurate to four ULPs, results in an inaccuracy of four ULPs
    //  plus 0.5 ULPs for the multiplication.
    // To compute the distance to the plane, a dot product is needed - that is a multiplication and
    //  an addition on each number.
    static const int distanceToleranceInULPs = toleranceInULPs + 1;
    // The squared distance between two 3D vectors is computed the same way, but with an additional
    //  subtraction.
    static const int distance3DToleranceInULPs = distanceToleranceInULPs + 1;

    // Convert the plane distance to its signed integer representation so the ULPs tolerance can be
    //  applied. For some reason, VC won't optimize two calls of the bit pattern conversion.
    const BinFloat minDistBinary = ToBinary( pPosition * mPlaneNormal) - distanceToleranceInULPs;
    const BinFloat maxDistBinary = minDistBinary + 2 * distanceToleranceInULPs;

    // clear the array in this strange fashion because a simple clear() would also deallocate
    // the array which we want to avoid
    poResults.resize( 0 );

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        // Ugly, but conditional jumps are faster with integers than with floats
        if( minDistBinary > ToBinary(mPositions[index].mDistance))
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && minDistBinary < ToBinary(mPositions[index].mDistance) )
        index--;
    while( index < (mPositions.size() - 1) && minDistBinary > ToBinary(mPositions[index].mDistance))
        index++;

    // Now start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the tolerance to the result array
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    while( ToBinary(it->mDistance) < maxDistBinary)
    {
        if( distance3DToleranceInULPs >= ToBinary((it->mPosition - pPosition).SquareLength()))
            poResults.push_back(it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}